

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<long_double>::Read(TPZFMatrix<long_double> *this,TPZStream *buf,void *context)

{
  long lVar1;
  long lVar2;
  long *in_RSI;
  long *in_RDI;
  int64_t col;
  int64_t row;
  TPZStream *in_stack_ffffffffffffffd8;
  TPZBaseMatrix *in_stack_ffffffffffffffe0;
  
  TPZBaseMatrix::Read(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  lVar1 = in_RDI[1];
  lVar2 = in_RDI[2];
  in_RDI[2] = 0;
  in_RDI[1] = 0;
  (**(code **)(*in_RDI + 0x68))(in_RDI,lVar1,lVar2);
  (**(code **)(*in_RSI + 0x118))(in_RSI,in_RDI[4],(int)in_RDI[1] * (int)in_RDI[2]);
  return;
}

Assistant:

void TPZFMatrix<TVar>::Read( TPZStream &buf, void *context ){ //ok
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value||
                  std::is_same<TVar, TPZFlopCounter>::value) {
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" not implemented for this type\n";
        PZError<<"Aborting...";
        DebugStop();
    }
    TPZMatrix<TVar>::Read(buf,context);
    int64_t row = this->fRow;
    int64_t col = this->fCol;
    //this is odd, but necessary.
    this->fRow = this->fCol = 0;
    Resize(row,col);
    buf.Read(fElem,this->fRow*this->fCol);
}